

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

subiter_type __thiscall
gnuplotio::
IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
::deref_subiter(IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
                *this)

{
  bool bVar1;
  runtime_error *this_00;
  reference arg;
  range_type rVar2;
  subiter_type sVar3;
  IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
  *this_local;
  
  bVar1 = is_end(this);
  if (!bVar1) {
    arg = __gnu_cxx::
          __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
          ::operator*(&this->it);
    rVar2 = ArrayTraitsImpl<std::vector<double,_std::allocator<double>_>,_void>::get_range(arg);
    sVar3.it._M_current = rVar2.it._M_current;
    sVar3.end._M_current = rVar2.end._M_current;
    return sVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"attepted to dereference past end of iterator");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

subiter_type deref_subiter() const {
        static_assert(sizeof(TV) && is_container,
            "deref_subiter called on non-nested container");
        if(is_end()) {
            throw std::runtime_error("attepted to dereference past end of iterator");
        }
        return ArrayTraits<TV>::get_range(*it);
    }